

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_offset_datetime<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  local_date lVar5;
  const_iterator rollback;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  size_type sVar8;
  int iVar9;
  int iVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  value_type *pvVar13;
  internal_error *piVar14;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_01
  ;
  ushort uVar15;
  _Alloc_hider ctx;
  ushort uVar16;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  string str;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  ofs;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inner_loc;
  result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  datetime;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  string local_2b0;
  allocator_type local_289;
  undefined1 local_288 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  region<std::vector<char,_std::allocator<char>_>_> local_250;
  undefined1 local_208 [16];
  region<std::vector<char,_std::allocator<char>_>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_188;
  string local_180;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_d8 [8];
  undefined1 local_d0 [88];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_78;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>,toml::detail::either<toml::detail::character<(char)84>,toml::detail::character<(char)116>,toml::detail::character<(char)32>>,toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>,toml::detail::either<toml::detail::character<(char)90>,toml::detail::character<(char)122>,toml::detail::sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_78,
             (sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>,toml::detail::either<toml::detail::character<(char)84>,toml::detail::character<(char)116>,toml::detail::character<(char)32>>,toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>,toml::detail::either<toml::detail::character<(char)90>,toml::detail::character<(char)122>,toml::detail::sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>>>>
              *)this,loc);
  if (local_78.is_ok_ == true) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar11 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_78);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_118,(detail *)(pvVar11->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar11->last_)._M_current,in_RCX);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    location(&local_160,&local_180,&local_118);
    loc_00 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      loc_00 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      loc_00 = extraout_RDX_01;
    }
    parse_local_datetime<std::__cxx11::string>
              ((result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d8,(detail *)&local_160,loc_00);
    if ((local_d8[0] != true) ||
       (last._M_current =
             ((local_160.source_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_M_dataplus)._M_p +
             (local_160.source_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_string_length, local_160.iter_._M_current == last._M_current)) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x28);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,
                 "[error]: toml::parse_offset_datetime: invalid datetime format","");
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_160;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[19],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_208,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_f8,(char (*) [19])"date, not datetime");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_208;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_288,__l_00,(allocator_type *)&local_188);
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)&local_260,&local_2b0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_288,&local_1a8);
      internal_error::internal_error(piVar14,(string *)&local_260);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>
    ::invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_208,
               (sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>
                *)&local_160,loc_01);
    if (local_208[0] == true) {
      pvVar12 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                          *)local_208);
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_260,(detail *)(pvVar12->first_)._M_current,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(pvVar12->last_)._M_current,last);
      if (*(char *)CONCAT44(local_260._M_allocated_capacity._4_4_,
                            local_260._M_allocated_capacity._0_4_) == '+') {
        std::__cxx11::string::substr((ulong)&local_2b0,(ulong)&local_260);
        local_288._0_8_ = (ulong)(uint)local_288._4_4_ << 0x20;
        iVar9 = from_string<int,int>(&local_2b0,(int *)local_288);
        uVar15 = (ushort)iVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_2b0,(ulong)&local_260);
        local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
        iVar10 = from_string<int,int>(&local_2b0,(int *)local_288);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_2b0,(ulong)&local_260);
        local_288._0_8_ = (ulong)(uint)local_288._4_4_ << 0x20;
        iVar9 = from_string<int,int>(&local_2b0,(int *)local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_2b0,(ulong)&local_260);
        local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
        iVar10 = from_string<int,int>(&local_2b0,(int *)local_288);
        uVar15 = -(short)iVar9;
        iVar10 = -iVar10;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((region<std::vector<char,_std::allocator<char>_>_> *)
          CONCAT44(local_260._M_allocated_capacity._4_4_,local_260._M_allocated_capacity._0_4_) !=
          &local_250) {
        operator_delete((region<std::vector<char,_std::allocator<char>_>_> *)
                        CONCAT44(local_260._M_allocated_capacity._4_4_,
                                 local_260._M_allocated_capacity._0_4_),
                        CONCAT71(local_250.super_region_base._vptr_region_base._1_7_,
                                 local_250.super_region_base._vptr_region_base._0_1_) + 1);
      }
      uVar16 = (ushort)(iVar10 << 8);
      uVar15 = uVar15 & 0xff;
    }
    else {
      if ((byte)(*local_160.iter_._M_current | 0x20U) != 0x7a) {
        piVar14 = (internal_error *)__cxa_allocate_exception(0x28);
        local_288._0_8_ = local_288 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,
                   "[error]: toml::parse_offset_datetime: invalid datetime format","");
        local_188 = &local_160;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[26],_true>
                  ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_260,&local_188,(char (*) [26])"should be `Z` or `+HH:MM`");
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&local_260;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1a8,__l_01,&local_289);
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_2b0,(string *)local_288,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1a8,&local_f8);
        internal_error::internal_error(piVar14,&local_2b0);
        __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
      }
      uVar15 = 0;
      uVar16 = 0;
    }
    if (local_208[0] == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_208 + 8));
    }
    pvVar13 = result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap((result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_d8);
    lVar5 = (pvVar13->first).date;
    local_2b0._M_string_length._0_2_ = (pvVar13->first).time.nanosecond;
    local_2b0._M_dataplus._M_p = *(pointer *)&(pvVar13->first).time;
    pvVar11 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_78);
    local_260._14_2_ = uVar15 | uVar16;
    local_260._M_allocated_capacity._4_4_ = SUB84(local_2b0._M_dataplus._M_p,0);
    local_260._8_4_ = (undefined4)((ulong)local_2b0._M_dataplus._M_p >> 0x20);
    local_260._12_2_ = (uint16_t)local_2b0._M_string_length;
    local_260._M_allocated_capacity._0_4_ = lVar5;
    region<std::vector<char,_std::allocator<char>_>_>::region(&local_250,pvVar11);
    sVar8 = local_250.source_name_._M_string_length;
    _Var7._M_pi = local_250.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar6 = local_250.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    paVar1 = &local_250.source_name_.field_2;
    local_208._0_8_ =
         CONCAT44(local_260._M_allocated_capacity._4_4_,local_260._M_allocated_capacity._0_4_);
    local_208._12_2_ = local_260._12_2_;
    local_208._8_4_ = local_260._8_4_;
    local_208._14_2_ = local_260._14_2_;
    paVar4 = &local_1f8.source_name_.field_2;
    local_1f8.super_region_base._vptr_region_base = (_func_int **)&PTR__region_00160ab8;
    local_250.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_250.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.source_name_._M_dataplus._M_p == paVar1) {
      local_1f8.source_name_.field_2._8_8_ = local_250.source_name_.field_2._8_8_;
      local_1f8.source_name_._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1f8.source_name_._M_dataplus._M_p = local_250.source_name_._M_dataplus._M_p;
    }
    local_1f8.source_name_.field_2._M_allocated_capacity._1_7_ =
         local_250.source_name_.field_2._M_allocated_capacity._1_7_;
    local_1f8.source_name_.field_2._M_local_buf[0] = local_250.source_name_.field_2._M_local_buf[0];
    local_250.source_name_._M_string_length = 0;
    local_250.source_name_.field_2._M_local_buf[0] = '\0';
    local_1f8.first_._M_current = local_250.first_._M_current;
    local_1f8.last_._M_current = local_250.last_._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p =
         (pointer)CONCAT44(local_260._M_allocated_capacity._4_4_,
                           local_260._M_allocated_capacity._0_4_);
    (__return_storage_ptr__->field_1).fail.value._M_string_length =
         CONCAT26(local_260._14_2_,CONCAT24(local_260._12_2_,local_260._8_4_));
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
         (size_type)&PTR__region_00160ab8;
    *(element_type **)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = peVar6;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    local_1f8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&__return_storage_ptr__->field_1 + 0x20) = _Var7._M_pi;
    local_1f8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    puVar2 = (undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38);
    *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x28) = puVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.source_name_._M_dataplus._M_p == paVar4) {
      *puVar2 = local_1f8.source_name_.field_2._0_8_;
      ((const_iterator *)
      ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8))->
      _M_current = (char *)local_1f8.source_name_.field_2._8_8_;
    }
    else {
      *(pointer *)((long)&__return_storage_ptr__->field_1 + 0x28) =
           local_1f8.source_name_._M_dataplus._M_p;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) =
           local_1f8.source_name_.field_2._0_8_;
    }
    *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x30) = sVar8;
    local_1f8.source_name_._M_string_length = 0;
    local_1f8.source_name_.field_2._0_8_ =
         (ulong)(uint7)local_250.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_250.first_._M_current;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = local_250.last_._M_current;
    ctx._M_p = local_1f8.source_name_._M_dataplus._M_p;
    local_250.source_name_._M_dataplus._M_p = (pointer)paVar1;
    local_1f8.source_name_._M_dataplus._M_p = (pointer)paVar4;
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_1f8);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_250);
    result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_d8,(EVP_PKEY_CTX *)ctx._M_p);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~location(&local_160);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    p_Var3 = &local_160.source_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    local_160.super_region_base._vptr_region_base = (_func_int **)p_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"[error]: toml::parse_offset_datetime: ","");
    local_d8 = (undefined1  [8])this;
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"the next token is not a offset_datetime","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_d8;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2b0,__l,(allocator_type *)&local_1a8);
    local_288._0_8_ = (pointer)0x0;
    local_288._8_8_ = (pointer)0x0;
    local_288._16_8_ = (pointer)0x0;
    format_underline((string *)&local_260,(string *)&local_160,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_2b0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_288);
    local_208._0_8_ =
         CONCAT44(local_260._M_allocated_capacity._4_4_,local_260._M_allocated_capacity._0_4_);
    if ((region<std::vector<char,_std::allocator<char>_>_> *)local_208._0_8_ == &local_250) {
      local_1f8.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_250.source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_208._0_8_ = &local_1f8;
    }
    local_1f8.super_region_base._vptr_region_base._1_7_ =
         local_250.super_region_base._vptr_region_base._1_7_;
    local_1f8.super_region_base._vptr_region_base._0_1_ =
         local_250.super_region_base._vptr_region_base._0_1_;
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((region<std::vector<char,_std::allocator<char>_>_> *)local_208._0_8_ == &local_1f8) {
      paVar1->_M_allocated_capacity = (size_type)local_1f8.super_region_base._vptr_region_base;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_1f8.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_208._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
           (size_type)local_1f8.super_region_base._vptr_region_base;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length =
         CONCAT26(local_260._14_2_,CONCAT24(local_260._12_2_,local_260._8_4_));
    local_1f8.super_region_base._vptr_region_base =
         (_func_int **)((ulong)local_250.super_region_base._vptr_region_base._1_7_ << 8);
    local_208._8_8_ = (_func_int **)0x0;
    local_250.super_region_base._vptr_region_base._0_1_ = 0;
    local_260._14_2_ = 0;
    local_260._12_2_ = 0;
    local_260._8_4_ = 0;
    local_208._0_8_ = &local_1f8;
    local_260._M_allocated_capacity = (size_type)&local_250;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_2b0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_160.super_region_base._vptr_region_base
        != p_Var3) {
      operator_delete(local_160.super_region_base._vptr_region_base,
                      (ulong)((long)&(local_160.source_.
                                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
  }
  if (local_78.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<offset_datetime, region<Container>>, std::string>
parse_offset_datetime(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_offset_date_time::invoke(loc))
    {
        location<std::string> inner_loc(loc.name(), token.unwrap().str());
        const auto datetime = parse_local_datetime(inner_loc);
        if(!datetime || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_offset_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "date, not datetime"}}));
        }
        time_offset offset(0, 0);
        if(const auto ofs = lex_time_numoffset::invoke(inner_loc))
        {
            const auto str = ofs.unwrap().str();
            if(str.front() == '+')
            {
                offset.hour   = static_cast<std::int8_t>(from_string<int>(str.substr(1,2), 0));
                offset.minute = static_cast<std::int8_t>(from_string<int>(str.substr(4,2), 0));
            }
            else
            {
                offset.hour   = -static_cast<std::int8_t>(from_string<int>(str.substr(1,2), 0));
                offset.minute = -static_cast<std::int8_t>(from_string<int>(str.substr(4,2), 0));
            }
        }
        else if(*inner_loc.iter() != 'Z' && *inner_loc.iter() != 'z')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_offset_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "should be `Z` or `+HH:MM`"}}));
        }
        return ok(std::make_pair(offset_datetime(datetime.unwrap().first, offset),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("[error]: toml::parse_offset_datetime: ",
            {{std::addressof(loc), "the next token is not a offset_datetime"}}));
    }
}